

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O3

GlobalPtr<int> BCL::local_malloc<int>(size_t size)

{
  ulong uVar1;
  ulong *puVar2;
  int iVar3;
  ulong uVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  size_t sVar10;
  GlobalPtr<int> GVar11;
  
  if (bcl_finalized == '\0') {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
    puVar9 = smem_heap;
    puVar5 = flist;
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    uVar4 = size * 4 + 0x3f & 0xffffffffffffffc0;
    for (puVar2 = flist; puVar2 != (ulong *)0x0; puVar2 = (ulong *)puVar2[2]) {
      uVar1 = *puVar2;
      if (uVar4 <= uVar1) {
        puVar9 = puVar2;
        if (uVar4 + 0x80 < uVar1) {
          puVar7 = (ulong *)((long)puVar2 + uVar4 + 0x40);
          *puVar7 = (uVar1 - uVar4) - 0x40;
          uVar1 = puVar2[1];
          *(ulong *)((long)puVar2 + uVar4 + 0x48) = uVar1;
          uVar8 = puVar2[2];
          *(ulong *)((long)puVar2 + uVar4 + 0x50) = uVar8;
          if (uVar1 != 0) {
            *(ulong **)(uVar1 + 0x10) = puVar7;
            uVar8 = puVar2[2];
          }
          if (uVar8 != 0) {
            *(ulong **)(uVar8 + 8) = puVar7;
          }
          *puVar2 = uVar4;
          puVar2[1] = 0;
          puVar2[2] = 0;
          puVar5 = smem_heap;
          if (puVar2 == flist) {
            flist = puVar7;
          }
        }
        else {
          uVar4 = puVar2[1];
          puVar7 = (ulong *)puVar2[2];
          if (uVar4 != 0) {
            *(ulong **)(uVar4 + 0x10) = puVar7;
          }
          if (puVar7 != (ulong *)0x0) {
            puVar7[1] = uVar4;
          }
          if (puVar2 == puVar5) {
            flist = puVar7;
          }
          puVar2[1] = 0;
          puVar2[2] = 0;
          puVar5 = smem_heap;
        }
        goto LAB_00105fee;
      }
    }
    *smem_heap = uVar4;
    puVar5 = (ulong *)((long)puVar9 + uVar4 + 0x40);
    puVar9[1] = 0;
    puVar9[2] = 0;
    if (puVar5 <= (ulong *)(smem_base_ptr + shared_segment_size)) {
LAB_00105fee:
      smem_heap = puVar5;
      pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      sVar10 = (long)puVar9 + (0x40 - smem_base_ptr);
      sVar6 = my_rank;
      goto LAB_00106008;
    }
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  }
  sVar10 = 0;
  sVar6 = 0;
LAB_00106008:
  GVar11.ptr = sVar10;
  GVar11.rank = sVar6;
  return GVar11;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}